

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  ushort uVar1;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  ushort uVar4;
  KeyValue *extraout_RDX;
  KeyValue *pKVar5;
  ulong uVar6;
  ulong uVar8;
  KeyValue *this_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar10;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_38;
  ulong uVar7;
  
  uVar1 = this->flat_capacity_;
  this_00 = (this->map_).flat;
  if (0x100 < uVar1) {
    local_38.second.field_0.int64_value = 0;
    local_38.second.type = '\0';
    local_38.second.is_repeated = false;
    local_38.second._10_1_ = 0;
    local_38.second.is_packed = false;
    local_38.second.cached_size = 0;
    local_38.second.descriptor = (FieldDescriptor *)0x0;
    local_38.first = key;
    pVar10 = std::
             _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
             ::
             _M_insert_unique<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                       ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                         *)this_00,&local_38);
    pVar9._8_8_ = pVar10._8_8_;
    pVar9.first = (Extension *)&pVar10.first._M_node._M_node[1]._M_parent;
    return pVar9;
  }
  uVar4 = this->flat_size_;
  pKVar5 = this_00 + uVar4;
  uVar7 = (ulong)uVar4;
  if (uVar4 != 0) {
    do {
      uVar6 = uVar7 >> 1;
      uVar8 = uVar6;
      if (this_00[uVar6].first < key) {
        uVar8 = ~uVar6 + uVar7;
        this_00 = this_00 + uVar6 + 1;
      }
      uVar7 = uVar8;
    } while (0 < (long)uVar8);
  }
  if (this_00 == pKVar5) {
    if (uVar1 <= uVar4) goto LAB_002b8084;
  }
  else {
    if (this_00->first == key) {
      pVar2._8_8_ = 0;
      pVar2.first = &this_00->second;
      return pVar2;
    }
    if (uVar1 <= uVar4) {
LAB_002b8084:
      GrowCapacity(this,(ulong)uVar4 + 1);
      pVar9 = Insert(this,key);
      return pVar9;
    }
    memmove(this_00 + 1,this_00,(long)pKVar5 - (long)this_00);
    uVar4 = this->flat_size_;
    pKVar5 = extraout_RDX;
  }
  this->flat_size_ = uVar4 + 1;
  this_00->first = key;
  (this_00->second).field_0.int64_value = 0;
  (this_00->second).type = '\0';
  (this_00->second).is_repeated = false;
  (this_00->second).field_0xa = 0;
  (this_00->second).is_packed = false;
  (this_00->second).cached_size = 0;
  (this_00->second).descriptor = (FieldDescriptor *)0x0;
  pVar3._9_7_ = (int7)((ulong)pKVar5 >> 8);
  pVar3.second = true;
  pVar3.first = &this_00->second;
  return pVar3;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    auto maybe = map_.large->insert({key, Extension()});
    return {&maybe.first->second, maybe.second};
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return {&it->second, false};
  }
  if (flat_size_ < flat_capacity_) {
    std::copy_backward(it, end, end + 1);
    ++flat_size_;
    it->first = key;
    it->second = Extension();
    return {&it->second, true};
  }
  GrowCapacity(flat_size_ + 1);
  return Insert(key);
}